

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::IsPropertyUnscopable(Var instanceVar,PropertyId propertyId)

{
  BOOL BVar1;
  Var local_48;
  Var value;
  DynamicObject *unscopablesList;
  Var unscopables;
  ScriptContext *scriptContext;
  RecyclableObject *instance;
  Var pvStack_18;
  PropertyId propertyId_local;
  Var instanceVar_local;
  
  instance._4_4_ = propertyId;
  pvStack_18 = instanceVar;
  scriptContext = (ScriptContext *)VarTo<Js::RecyclableObject>(instanceVar);
  unscopables = RecyclableObject::GetScriptContext((RecyclableObject *)scriptContext);
  unscopablesList =
       (DynamicObject *)
       GetProperty((RecyclableObject *)scriptContext,0x1c,(ScriptContext *)unscopables,
                   (PropertyValueInfo *)0x0);
  BVar1 = IsObject(unscopablesList);
  if (BVar1 != 0) {
    value = VarTo<Js::DynamicObject>(unscopablesList);
    local_48 = (Var)0x0;
    BVar1 = GetProperty((RecyclableObject *)value,instance._4_4_,&local_48,
                        (ScriptContext *)unscopables,(PropertyValueInfo *)0x0);
    if (BVar1 != 0) {
      BVar1 = JavascriptConversion::ToBoolean(local_48,(ScriptContext *)unscopables);
      return BVar1;
    }
  }
  return 0;
}

Assistant:

BOOL JavascriptOperators::IsPropertyUnscopable(Var instanceVar, PropertyId propertyId)
    {
        RecyclableObject* instance = VarTo<RecyclableObject>(instanceVar);
        ScriptContext * scriptContext = instance->GetScriptContext();

        Var unscopables = JavascriptOperators::GetProperty(instance, PropertyIds::_symbolUnscopables, scriptContext);
        if (JavascriptOperators::IsObject(unscopables))
        {
            DynamicObject *unscopablesList = VarTo<DynamicObject>(unscopables);
            Var value = nullptr;
            //8.1.1.2.1.9.c If blocked is not undefined
            if (JavascriptOperators::GetProperty(unscopablesList, propertyId, &value, scriptContext))
            {
                return JavascriptConversion::ToBoolean(value, scriptContext);
            }
        }

        return false;
    }